

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkInteger
          (GetConfigAttribSimpleCase *this,EGLenum attrib,EGLint value)

{
  MessageBuilder *this_00;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  EGLint value_local;
  EGLenum attrib_local;
  GetConfigAttribSimpleCase *this_local;
  
  if ((((attrib != 0x302e) && (attrib != 0x302f)) && (attrib == 0x3028)) && (value < 1)) {
    log._0_4_ = value;
    log._4_4_ = attrib;
    _value_local = this;
    local_20 = tcu::TestContext::getLog
                         ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1a0,
                         (char (*) [69])
                         "Fail, config IDs should be positive integer values beginning from 1.");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid value");
  }
  return;
}

Assistant:

void checkInteger (EGLenum attrib, EGLint value)
	{
		if (attrib == EGL_NATIVE_VISUAL_ID || attrib == EGL_NATIVE_VISUAL_TYPE) // Implementation-defined
			return;

		if (attrib == EGL_CONFIG_ID && value < 1)
		{
			TestLog&	log	= m_testCtx.getLog();

			log << TestLog::Message << "Fail, config IDs should be positive integer values beginning from 1." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");
		}
	}